

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall pbrt::StatsAccumulator::WritePixelImages(StatsAccumulator *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  char *pcVar5;
  undefined1 *puVar6;
  long *in_RDI;
  ImageMetadata *in_stack_00000230;
  string *in_stack_00000238;
  Image *in_stack_00000240;
  anon_class_1_0_00000001 AllZero_1;
  size_t j_1;
  string n_1;
  size_t i_1;
  anon_class_1_0_00000001 AllZero;
  size_t j;
  string n;
  size_t i;
  undefined1 in_stack_fffffffffffff9c8 [64];
  anon_class_1_0_00000001 *in_stack_fffffffffffffa08;
  char (*in_stack_fffffffffffffa10) [57];
  char *in_stack_fffffffffffffa18;
  int in_stack_fffffffffffffa24;
  char *in_stack_fffffffffffffa28;
  LogLevel in_stack_fffffffffffffa34;
  undefined1 in_stack_fffffffffffffa38 [16];
  reference in_stack_fffffffffffffa48;
  optional<float> local_428;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_420;
  undefined4 local_3e0;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_3dc;
  undefined4 local_39c;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_398;
  undefined4 local_388;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_384;
  undefined4 local_37c;
  optional<int> local_378;
  optional<float> local_370;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 uStack_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  ulong local_320;
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  ulong local_2b8;
  optional<float> local_2b0;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_2a8;
  undefined4 local_268;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_264;
  undefined4 local_224;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_220;
  undefined4 local_210;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_20c;
  undefined4 local_204;
  optional<int> local_200;
  optional<float> local_1f8;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  ulong local_1a8;
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  ulong local_140;
  optional<float> local_128;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_120;
  undefined4 local_e0;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_dc;
  undefined4 local_9c;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_98;
  undefined4 local_88;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_84;
  undefined4 local_7c;
  optional<int> local_78;
  optional<float> local_70;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  string local_28 [40];
  
  std::operator+(in_stack_fffffffffffff9c8._48_8_,in_stack_fffffffffffff9c8._40_8_);
  local_128.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_128.set = false;
  local_128._5_3_ = 0;
  pstd::optional<float>::optional(&local_128);
  local_120 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
              vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_e0 = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_120.__align);
  local_dc = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
             vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_9c = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_dc.__align);
  local_98 = (aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)>)0x0;
  local_88 = 0;
  pstd::optional<pbrt::Bounds2<int>_>::optional((optional<pbrt::Bounds2<int>_> *)&local_98.__align);
  local_7c = 0;
  local_84 = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0x0;
  pstd::optional<pbrt::Point2<int>_>::optional((optional<pbrt::Point2<int>_> *)&local_84.__align);
  local_78.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  local_78.set = false;
  local_78._5_3_ = 0;
  pstd::optional<int>::optional(&local_78);
  local_70.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_70.set = false;
  local_70._5_3_ = 0;
  pstd::optional<float>::optional(&local_70);
  local_68 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
              )0x0;
  uStack_60 = 0;
  pstd::optional<const_pbrt::RGBColorSpace_*>::optional
            ((optional<const_pbrt::RGBColorSpace_*> *)&local_68.__align);
  uStack_38 = 0;
  uStack_30 = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x5f2dcd);
  bVar2 = Image::Write(in_stack_00000240,in_stack_00000238,in_stack_00000230);
  if (!bVar2) {
    LogFatal<char_const(&)[57]>
              (in_stack_fffffffffffffa34,in_stack_fffffffffffffa28,in_stack_fffffffffffffa24,
               in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
  }
  ImageMetadata::~ImageMetadata(in_stack_fffffffffffff9c8._8_8_);
  std::__cxx11::string::~string(local_28);
  local_140 = 0;
  do {
    uVar1 = local_140;
    sVar3 = std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::size
                      ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*in_RDI + 0x280));
    if (sVar3 <= uVar1) {
      local_2b8 = 0;
      do {
        uVar1 = local_2b8;
        sVar3 = std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::size
                          ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*in_RDI + 0x2b0));
        if (sVar3 <= uVar1) {
          return;
        }
        std::operator+(in_stack_fffffffffffff9c8._48_8_,in_stack_fffffffffffff9c8._40_8_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(*in_RDI + 0x298),local_2b8);
        std::operator+(in_stack_fffffffffffff9c8._16_8_,in_stack_fffffffffffff9c8._8_8_);
        std::operator+(in_stack_fffffffffffff9c8._16_8_,in_stack_fffffffffffff9c8._8_8_);
        std::__cxx11::string::~string(local_2f8);
        std::__cxx11::string::~string(local_318);
        local_320 = 0;
        while( true ) {
          uVar1 = local_320;
          uVar4 = std::__cxx11::string::size();
          if (uVar4 <= uVar1) break;
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_2d8);
          if (*pcVar5 == '/') {
            puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_2d8);
            *puVar6 = 0x5f;
          }
          local_320 = local_320 + 1;
        }
        std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::operator[]
                  ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*in_RDI + 0x2b0),local_2b8)
        ;
        bVar2 = WritePixelImages::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)in_stack_fffffffffffffa48,
                           in_stack_fffffffffffffa38._8_8_);
        if (!bVar2) {
          in_stack_fffffffffffffa48 =
               std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::operator[]
                         ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*in_RDI + 0x2b0),
                          local_2b8);
          local_428.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          local_428.set = false;
          local_428._5_3_ = 0;
          pstd::optional<float>::optional(&local_428);
          in_stack_fffffffffffff9c8 = ZEXT1664((undefined1  [16])0x0);
          local_420 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>
                       )vmovdqu64_avx512f(in_stack_fffffffffffff9c8);
          local_3e0 = 0;
          pstd::optional<pbrt::SquareMatrix<4>_>::optional
                    ((optional<pbrt::SquareMatrix<4>_> *)&local_420.__align);
          local_3dc = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>
                       )vmovdqu64_avx512f(in_stack_fffffffffffff9c8);
          local_39c = 0;
          pstd::optional<pbrt::SquareMatrix<4>_>::optional
                    ((optional<pbrt::SquareMatrix<4>_> *)&local_3dc.__align);
          in_stack_fffffffffffffa38 = (undefined1  [16])0x0;
          local_398 = (aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)>)
                      0x0;
          local_388 = 0;
          pstd::optional<pbrt::Bounds2<int>_>::optional
                    ((optional<pbrt::Bounds2<int>_> *)&local_398.__align);
          local_37c = 0;
          local_384 = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0x0;
          pstd::optional<pbrt::Point2<int>_>::optional
                    ((optional<pbrt::Point2<int>_> *)&local_384.__align);
          local_378.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          local_378.set = false;
          local_378._5_3_ = 0;
          pstd::optional<int>::optional(&local_378);
          local_370.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          local_370.set = false;
          local_370._5_3_ = 0;
          pstd::optional<float>::optional(&local_370);
          uStack_360 = 0;
          local_368 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                       )0x0;
          pstd::optional<const_pbrt::RGBColorSpace_*>::optional
                    ((optional<const_pbrt::RGBColorSpace_*> *)&local_368.__align);
          uStack_338 = 0;
          uStack_330 = 0;
          local_358 = 0;
          uStack_350 = 0;
          uStack_348 = 0;
          uStack_340 = 0;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)0x5f3688);
          bVar2 = Image::Write(in_stack_00000240,in_stack_00000238,in_stack_00000230);
          if (!bVar2) {
            LogFatal<char_const(&)[36]>
                      (in_stack_fffffffffffffa34,in_stack_fffffffffffffa28,in_stack_fffffffffffffa24
                       ,in_stack_fffffffffffffa18,(char (*) [36])in_stack_fffffffffffffa10);
          }
          ImageMetadata::~ImageMetadata(in_stack_fffffffffffff9c8._8_8_);
        }
        std::__cxx11::string::~string(local_2d8);
        local_2b8 = local_2b8 + 1;
      } while( true );
    }
    std::operator+(in_stack_fffffffffffff9c8._48_8_,in_stack_fffffffffffff9c8._40_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(*in_RDI + 0x268),local_140);
    std::operator+(in_stack_fffffffffffff9c8._16_8_,in_stack_fffffffffffff9c8._8_8_);
    std::operator+(in_stack_fffffffffffff9c8._16_8_,in_stack_fffffffffffff9c8._8_8_);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_1a0);
    local_1a8 = 0;
    while( true ) {
      uVar1 = local_1a8;
      uVar4 = std::__cxx11::string::size();
      if (uVar4 <= uVar1) break;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_160);
      if (*pcVar5 == '/') {
        puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_160);
        *puVar6 = 0x5f;
      }
      local_1a8 = local_1a8 + 1;
    }
    std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::operator[]
              ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*in_RDI + 0x280),local_140);
    bVar2 = WritePixelImages::anon_class_1_0_00000001::operator()
                      (in_stack_fffffffffffffa08,in_stack_fffffffffffff9c8._56_8_);
    if (!bVar2) {
      std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::operator[]
                ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*in_RDI + 0x280),local_140);
      local_2b0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      local_2b0.set = false;
      local_2b0._5_3_ = 0;
      pstd::optional<float>::optional(&local_2b0);
      local_2a8 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
                  vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      local_268 = 0;
      pstd::optional<pbrt::SquareMatrix<4>_>::optional
                ((optional<pbrt::SquareMatrix<4>_> *)&local_2a8.__align);
      local_264 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
                  vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      local_224 = 0;
      pstd::optional<pbrt::SquareMatrix<4>_>::optional
                ((optional<pbrt::SquareMatrix<4>_> *)&local_264.__align);
      local_220 = (aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)>)0x0;
      local_210 = 0;
      pstd::optional<pbrt::Bounds2<int>_>::optional
                ((optional<pbrt::Bounds2<int>_> *)&local_220.__align);
      local_204 = 0;
      local_20c = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0x0;
      pstd::optional<pbrt::Point2<int>_>::optional
                ((optional<pbrt::Point2<int>_> *)&local_20c.__align);
      local_200.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      local_200.set = false;
      local_200._5_3_ = 0;
      pstd::optional<int>::optional(&local_200);
      local_1f8.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      local_1f8.set = false;
      local_1f8._5_3_ = 0;
      pstd::optional<float>::optional(&local_1f8);
      local_1f0 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                   )0x0;
      uStack_1e8 = 0;
      pstd::optional<const_pbrt::RGBColorSpace_*>::optional
                ((optional<const_pbrt::RGBColorSpace_*> *)&local_1f0.__align);
      uStack_1c0 = 0;
      uStack_1b8 = 0;
      local_1e0 = 0;
      uStack_1d8 = 0;
      uStack_1d0 = 0;
      uStack_1c8 = 0;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             *)0x5f3221);
      bVar2 = Image::Write(in_stack_00000240,in_stack_00000238,in_stack_00000230);
      if (!bVar2) {
        LogFatal<char_const(&)[38]>
                  (in_stack_fffffffffffffa34,in_stack_fffffffffffffa28,in_stack_fffffffffffffa24,
                   in_stack_fffffffffffffa18,(char (*) [38])in_stack_fffffffffffffa10);
      }
      ImageMetadata::~ImageMetadata(in_stack_fffffffffffff9c8._8_8_);
    }
    std::__cxx11::string::~string(local_160);
    local_140 = local_140 + 1;
  } while( true );
}

Assistant:

void StatsAccumulator::WritePixelImages() const {
    // FIXME: do this where?
    CHECK(stats->pixelTime.Write(pixelStatsBaseName + "-time.exr"));

    for (size_t i = 0; i < stats->pixelCounterImages.size(); ++i) {
        std::string n = pixelStatsBaseName + "-" + stats->pixelCounterNames[i] + ".exr";
        for (size_t j = 0; j < n.size(); ++j)
            if (n[j] == '/')
                n[j] = '_';

        auto AllZero = [](const Image &im) {
            for (int y = 0; y < im.Resolution().y; ++y)
                for (int x = 0; x < im.Resolution().x; ++x)
                    if (im.GetChannel({x, y}, 0) != 0)
                        return false;
            return true;
        };
        if (!AllZero(stats->pixelCounterImages[i]))
            CHECK(stats->pixelCounterImages[i].Write(n));
    }

    for (size_t i = 0; i < stats->pixelRatioImages.size(); ++i) {
        std::string n = pixelStatsBaseName + "-" + stats->pixelRatioNames[i] + ".exr";
        for (size_t j = 0; j < n.size(); ++j)
            if (n[j] == '/')
                n[j] = '_';

        auto AllZero = [](const Image &im) {
            for (int y = 0; y < im.Resolution().y; ++y)
                for (int x = 0; x < im.Resolution().x; ++x)
                    if (im.GetChannels({x, y}).MaxValue() != 0)
                        return false;
            return true;
        };
        if (!AllZero(stats->pixelRatioImages[i]))
            CHECK(stats->pixelRatioImages[i].Write(n));
    }
}